

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O3

void convert_digit_sequence_for_numerical_reading(NJDNode *start,NJDNode *end)

{
  _NJDNode *p_Var1;
  bool bVar2;
  bool bVar3;
  NJDNode *pNVar4;
  uint uVar5;
  int iVar6;
  _NJDNode *p_Var7;
  uint uVar8;
  NJDNode *node;
  uint uVar9;
  int iVar10;
  
  p_Var1 = end->next;
  if (p_Var1 != start) {
    uVar5 = 0;
    p_Var7 = start;
    do {
      p_Var7 = p_Var7->next;
      uVar5 = uVar5 - 1;
    } while (p_Var7 != p_Var1);
    if (uVar5 != 0xffffffff) {
      uVar9 = 4;
      if ((-uVar5 & 3) != 0) {
        uVar9 = -uVar5 & 3;
      }
      uVar8 = 0;
      if (uVar9 <= ~uVar5) {
        iVar6 = uVar5 + uVar9;
        iVar10 = 3 - iVar6;
        if (iVar6 < 1) {
          iVar10 = -iVar6;
        }
        if (0x47 < -iVar6) {
          return;
        }
        uVar8 = iVar10 >> 2;
      }
      if (p_Var1 != start) {
        iVar10 = uVar9 - 1;
        bVar3 = false;
        do {
          iVar6 = get_digit(start,0);
          if (iVar10 == 0) {
            if (iVar6 == 0) {
              NJDNode_set_pron(start,(char *)0x0);
              NJDNode_set_acc(start,0);
              NJDNode_set_mora_size(start,0);
              if (bVar3) goto LAB_0014a035;
            }
            else {
LAB_0014a035:
              if (0 < (int)uVar8) {
                pNVar4 = (NJDNode *)calloc(1,0x78);
                NJDNode_initialize(pNVar4);
                NJDNode_load(pNVar4,njd_set_digit_rule_numeral_list3[uVar8]);
                start = NJDNode_insert(start,start->next,pNVar4);
              }
            }
            uVar8 = uVar8 - 1;
            bVar3 = false;
          }
          else if (iVar6 < 1) {
            NJDNode_set_pron(start,(char *)0x0);
            NJDNode_set_acc(start,0);
            NJDNode_set_mora_size(start,0);
          }
          else {
            if (iVar6 == 1) {
              NJDNode_load(start,njd_set_digit_rule_numeral_list2[iVar10]);
            }
            else {
              pNVar4 = (NJDNode *)calloc(1,0x78);
              NJDNode_initialize(pNVar4);
              NJDNode_load(pNVar4,njd_set_digit_rule_numeral_list2[iVar10]);
              start = NJDNode_insert(start,start->next,pNVar4);
            }
            bVar3 = true;
          }
          bVar2 = iVar10 < 1;
          iVar10 = iVar10 + -1;
          if (bVar2) {
            iVar10 = 3;
          }
          start = start->next;
        } while (start != end->next);
      }
    }
  }
  return;
}

Assistant:

static void convert_digit_sequence_for_numerical_reading(NJDNode * start, NJDNode * end)
{
   NJDNode *node;
   NJDNode *newnode;
   int digit;
   int place = 0;
   int index;
   int size = 0;
   int have = 0;

   for (node = start; node != end->next; node = node->next)
      size++;
   if (size <= 1)
      return;

   index = size % 4;
   if (index == 0)
      index = 4;
   if (size > index)
      place = (size - index) / 4;
   index--;
   if (place > 17)
      return;

   for (node = start; node != end->next; node = node->next) {
      digit = get_digit(node, 0);
      if (index == 0) {
         if (digit == 0) {
            NJDNode_set_pron(node, NULL);
            NJDNode_set_acc(node, 0);
            NJDNode_set_mora_size(node, 0);
         } else {
            have = 1;
         }
         if (have == 1) {
            if (place > 0) {
               newnode = (NJDNode *) calloc(1, sizeof(NJDNode));
               NJDNode_initialize(newnode);
               NJDNode_load(newnode, (char *) njd_set_digit_rule_numeral_list3[place]);
               node = NJDNode_insert(node, node->next, newnode);
            }
            have = 0;
         }
         place--;
      } else {
         if (digit <= 0) {
            NJDNode_set_pron(node, NULL);
            NJDNode_set_acc(node, 0);
            NJDNode_set_mora_size(node, 0);
         } else if (digit == 1) {
            NJDNode_load(node, (char *) njd_set_digit_rule_numeral_list2[index]);
            have = 1;
         } else {
            newnode = (NJDNode *) calloc(1, sizeof(NJDNode));
            NJDNode_initialize(newnode);
            NJDNode_load(newnode, (char *) njd_set_digit_rule_numeral_list2[index]);
            node = NJDNode_insert(node, node->next, newnode);
            have = 1;
         }
      }
      index--;
      if (index < 0)
         index = 4 - 1;
   }
}